

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<capnp::_::RawSchema_*>::setCapacity(Vector<capnp::_::RawSchema_*> *this,size_t newSize)

{
  RawSchema **ppRVar1;
  ArrayBuilder<capnp::_::RawSchema_*> newBuilder;
  ArrayBuilder<capnp::_::RawSchema_*> local_30;
  
  ppRVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)ppRVar1 >> 3)) {
    (this->builder).pos = ppRVar1 + newSize;
  }
  local_30.ptr = _::HeapArrayDisposer::allocateUninitialized<capnp::_::RawSchema*>(newSize);
  local_30.endPtr = local_30.ptr + newSize;
  local_30.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_30.pos = local_30.ptr;
  ArrayBuilder<capnp::_::RawSchema*>::addAll<kj::ArrayBuilder<capnp::_::RawSchema*>>
            ((ArrayBuilder<capnp::_::RawSchema*> *)&local_30,&this->builder);
  ArrayBuilder<capnp::_::RawSchema_*>::operator=(&this->builder,&local_30);
  ArrayBuilder<capnp::_::RawSchema_*>::dispose(&local_30);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }